

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_module **ppsVar1;
  uint uVar2;
  int iVar3;
  u32 uVar4;
  sqlite3_vtab *psVar5;
  sqlite3_module *psVar6;
  sqlite3_vtab *psVar7;
  Fts5IndexIter *pIndexIter;
  u32 uVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  u32 nData;
  long lVar17;
  void *__s1;
  ulong uVar18;
  u8 *puVar19;
  long in_FS_OFFSET;
  u32 ii;
  int iOff;
  int local_64;
  uint local_50;
  int local_4c;
  i64 local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar5 = pCursor->pVtab;
  psVar6 = pCursor[2].pVtab[1].pModule;
  uVar2 = *(uint *)&psVar6->xDisconnect;
  psVar7 = *(sqlite3_vtab **)(*(long *)&pCursor[2].pVtab[1].nRef + 0xa0);
  local_3c = (uint)(psVar7 != pCursor[5].pVtab) << 2;
  iVar10 = local_3c;
  if (psVar7 != pCursor[5].pVtab) goto LAB_001f707e;
  pCursor[0xb].pVtab = (sqlite3_vtab *)((long)&(pCursor[0xb].pVtab)->pModule + 1);
  uVar18 = (ulong)(int)uVar2;
  if (psVar5[2].nRef == 0) {
    iVar3 = *(int *)((long)&pCursor[8].pVtab + 4);
    uVar15 = (ulong)iVar3;
    uVar11 = iVar3 + 1;
    uVar12 = uVar15;
    if ((int)uVar11 < (int)uVar2) {
      uVar11 = uVar2;
    }
    do {
      uVar13 = uVar11;
      if ((long)uVar18 <= (long)(uVar12 + 1)) break;
      uVar13 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar13;
      lVar17 = uVar12 * 2;
      uVar12 = uVar12 + 1;
    } while (*(long *)(&(pCursor[10].pVtab)->nRef + lVar17) == 0);
    *(uint *)((long)&pCursor[8].pVtab + 4) = uVar13;
    if ((int)uVar2 <= *(int *)((long)&pCursor[8].pVtab + 4)) goto LAB_001f6d08;
  }
  else {
    if (psVar5[2].nRef == 2) {
      iVar3 = *(int *)((long)&psVar6->xBegin + 4);
      psVar5 = pCursor[4].pVtab;
      do {
        if ((iVar3 != 1) &&
           (iVar10 = sqlite3Fts5PoslistNext64
                               (*(u8 **)&psVar5->nRef,*(int *)&psVar5->zErrMsg,
                                (int *)(pCursor + 0xf),(i64 *)(pCursor + 0xe)), iVar10 == 0))
        goto LAB_001f6ddb;
        pCursor[0xe].pVtab = (sqlite3_vtab *)0x0;
        *(undefined4 *)&pCursor[0xf].pVtab = 0;
        iVar10 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
        if ((iVar10 == 0) &&
           ((iVar10 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor), iVar3 == 1 ||
            (*(int *)&pCursor[3].pVtab != 0)))) goto LAB_001f707e;
      } while (iVar10 == 0);
      *(undefined4 *)&pCursor[3].pVtab = 1;
      goto LAB_001f707e;
    }
LAB_001f6d08:
    psVar7 = pCursor[4].pVtab;
    if (*(char *)((long)&psVar7->zErrMsg + 4) == '\0') {
      lVar16 = (ulong)*(ushort *)&(psVar7[4].pModule)->field_0x4 * 0x80;
      lVar17 = *(long *)((long)psVar7 + lVar16 + 200);
      nData = *(int *)((long)psVar7 + lVar16 + 0xd0) - 1;
      puVar19 = (u8 *)(lVar17 + 1);
      if (lVar17 == 0) {
        puVar19 = (u8 *)0x0;
      }
      uVar4 = *(u32 *)&pCursor[6].pVtab;
      if (-1 < (int)uVar4) {
        uVar8 = uVar4;
        if ((int)nData < (int)uVar4) {
          uVar8 = nData;
        }
        iVar10 = memcmp(pCursor[7].pVtab,puVar19,(long)(int)uVar8);
        if ((iVar10 < 0) || ((int)uVar4 < (int)nData && iVar10 == 0)) {
          *(undefined4 *)&pCursor[3].pVtab = 1;
LAB_001f6ddb:
          iVar10 = 0;
          goto LAB_001f707e;
        }
      }
      *(undefined4 *)&pCursor[0xd].pVtab = 0;
      sqlite3Fts5BufferAppendBlob(&local_3c,(Fts5Buffer *)(pCursor + 0xc),nData,puVar19);
      memset(pCursor[9].pVtab,0,uVar18 * 8);
      memset(pCursor[10].pVtab,0,uVar18 * 8);
      *(undefined4 *)((long)&pCursor[8].pVtab + 4) = 0;
      local_64 = local_3c;
      do {
        iVar10 = local_64;
        if (local_64 != 0) break;
        iVar10 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xBegin + 4);
        local_48 = 0;
        local_4c = 0;
        pIndexIter = (Fts5IndexIter *)pCursor[4].pVtab;
        puVar19 = pIndexIter->pData;
        iVar3 = pIndexIter->nData;
        lVar17 = local_48;
        if (psVar5[2].nRef == 0) {
          if (iVar10 == 2) {
            while (iVar10 = sqlite3Fts5PoslistNext64(puVar19,iVar3,&local_4c,&local_48), iVar10 == 0
                  ) {
              if ((long)uVar18 <= local_48) {
                local_64 = 0x10b;
                break;
              }
              ppsVar1 = &(pCursor[10].pVtab)->pModule + local_48;
              *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
            }
          }
          else {
            if (iVar10 != 0) goto LAB_001f6fcd;
            uVar11 = 0xffffffff;
            do {
              iVar10 = sqlite3Fts5PoslistNext64(puVar19,iVar3,&local_4c,&local_48);
              if (iVar10 != 0) break;
              uVar13 = (uint)((ulong)local_48 >> 0x20);
              uVar14 = uVar13 & 0x7fffffff;
              if (uVar11 == uVar14) {
LAB_001f6f77:
                ppsVar1 = &(pCursor[9].pVtab)->pModule + (uVar13 & 0x7fffffff);
                *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
                bVar9 = true;
              }
              else {
                if ((int)uVar14 < (int)uVar2) {
                  ppsVar1 = &(pCursor[10].pVtab)->pModule + (uVar13 & 0x7fffffff);
                  *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
                  uVar11 = uVar14;
                  goto LAB_001f6f77;
                }
                local_64 = 0x10b;
                bVar9 = false;
              }
            } while (bVar9);
          }
        }
        else if (psVar5[2].nRef == 1) {
          if (((iVar10 == 0) && (((ulong)pCursor[8].pVtab & 4) != 0)) && (0 < iVar3)) {
            lVar17 = 0;
            do {
              local_50 = (uint)puVar19[lVar17];
              uVar12 = 1;
              if ((char)puVar19[lVar17] < '\0') {
                uVar11 = sqlite3Fts5GetVarint32(puVar19 + lVar17,&local_50);
                uVar12 = (ulong)uVar11;
              }
              lVar17 = lVar17 + uVar12;
              if (local_50 == 1) {
                local_50 = (uint)puVar19[lVar17];
                if ((char)puVar19[lVar17] < '\0') {
                  uVar11 = sqlite3Fts5GetVarint32(puVar19 + lVar17,&local_50);
                  lVar17 = lVar17 + (ulong)uVar11;
                }
                else {
                  lVar17 = lVar17 + 1;
                }
              }
              else {
                (pCursor[9].pVtab)->pModule =
                     (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
              }
            } while (lVar17 < iVar3);
          }
LAB_001f6fcd:
          local_48 = lVar17;
          (pCursor[10].pVtab)->pModule =
               (sqlite3_module *)((long)&(pCursor[10].pVtab)->pModule->iVersion + 1);
        }
        if (local_64 == 0) {
          local_64 = sqlite3Fts5IterNextScan(pIndexIter);
        }
        if (psVar5[2].nRef == 2) {
LAB_001f6ff9:
          bVar9 = false;
        }
        else {
          if (local_64 == 0) {
            psVar7 = pCursor[4].pVtab;
            lVar17 = (ulong)*(ushort *)&(psVar7[4].pModule)->field_0x4 * 0x80;
            iVar10 = *(int *)((long)psVar7 + lVar17 + 0xd0);
            lVar17 = *(long *)((long)psVar7 + lVar17 + 200);
            uVar11 = iVar10 - 1;
            __s1 = (void *)(lVar17 + 1);
            if (lVar17 == 0) {
              __s1 = (void *)0x0;
            }
            if (((uVar11 != *(uint *)&pCursor[0xd].pVtab) ||
                ((1 < iVar10 &&
                 (iVar10 = bcmp(__s1,((Fts5Buffer *)(pCursor + 0xc))->p,(ulong)uVar11), iVar10 != 0)
                 ))) || (*(char *)((long)&psVar7->zErrMsg + 4) != '\0')) goto LAB_001f6ff9;
          }
          bVar9 = true;
        }
        iVar10 = local_64;
      } while (bVar9);
    }
    else {
      *(undefined4 *)&pCursor[3].pVtab = 1;
    }
  }
  local_3c = iVar10;
  iVar10 = local_3c;
  if (((local_3c == 0) && (*(int *)&pCursor[3].pVtab == 0)) && (psVar5[2].nRef == 0)) {
    uVar11 = *(uint *)((long)&pCursor[8].pVtab + 4);
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < (int)uVar2) {
      uVar12 = (ulong)(int)uVar11;
      psVar5 = pCursor[10].pVtab;
      do {
        if ((&psVar5->pModule)[uVar12] != (sqlite3_module *)0x0) goto LAB_001f706b;
        iVar3 = (int)uVar12;
        uVar12 = uVar12 + 1;
        *(int *)((long)&pCursor[8].pVtab + 4) = iVar3 + 1;
        uVar11 = uVar2;
      } while (uVar18 != uVar12);
    }
    else {
LAB_001f706b:
      uVar11 = (uint)uVar12;
    }
    if (uVar11 == uVar2) {
      local_3c = 0x10b;
      iVar10 = local_3c;
    }
  }
LAB_001f707e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar10;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int nCol = pCsr->pFts5->pConfig->nCol;
  int rc;

  rc = sqlite3Fts5StructureTest(pCsr->pFts5->pIndex, pCsr->pStruct);
  if( rc!=SQLITE_OK ) return rc;
  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            /* Do not bother counting the number of instances if the "cnt"
            ** column is not being read (according to colUsed).  */
            if( eDetail==FTS5_DETAIL_FULL && (pCsr->colUsed & 0x04) ){
              while( iPos<nPos ){
                u32 ii;
                fts5FastGetVarint32(pPos, iPos, ii);
                if( ii==1 ){
                  /* New column in the position list */
                  fts5FastGetVarint32(pPos, iPos, ii);
                }else{
                  /* An instance - increment pCsr->aCnt[] */
                  pCsr->aCnt[0]++;
                }
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm))
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    for(/* noop */; pCsr->iCol<nCol && pCsr->aDoc[pCsr->iCol]==0; pCsr->iCol++);
    if( pCsr->iCol==nCol ){
      rc = FTS5_CORRUPT;
    }
  }
  return rc;
}